

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall Alice::LoadNextRandomPermutation(Alice *this)

{
  pointer piVar1;
  iterator iVar2;
  int iVar3;
  int local_40;
  long temp;
  
  if (LoadNextRandomPermutation()::pin == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextRandomPermutation()::pin);
    if (iVar3 != 0) {
      std::ifstream::ifstream
                (LoadNextRandomPermutation()::pin,"../randoms/alice/Permutations_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextRandomPermutation()::pin,&__dso_handle);
      __cxa_guard_release(&LoadNextRandomPermutation()::pin);
    }
  }
  if (LoadNextRandomPermutation()::din == '\0') {
    iVar3 = __cxa_guard_acquire(&LoadNextRandomPermutation()::din);
    if (iVar3 != 0) {
      std::ifstream::ifstream
                (LoadNextRandomPermutation()::din,"../randoms/alice/Permutations_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextRandomPermutation()::din,&__dso_handle);
      __cxa_guard_release(&LoadNextRandomPermutation()::din);
    }
  }
  piVar1 = (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  if (0 < (this->super_Party).n_p) {
    iVar3 = 0;
    do {
      std::istream::_M_extract<long>((long *)LoadNextRandomPermutation()::pin);
      iVar2._M_current =
           (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&(this->super_Party).Pi_P,iVar2,(int *)((long)&temp + 4));
      }
      else {
        *iVar2._M_current = local_40;
        (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->super_Party).n_p);
  }
  if (0 < (this->super_Party).n_d) {
    iVar3 = 0;
    do {
      std::istream::_M_extract<long>((long *)LoadNextRandomPermutation()::din);
      iVar2._M_current =
           (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&(this->super_Party).Pi_D,iVar2,(int *)((long)&temp + 4));
      }
      else {
        *iVar2._M_current = local_40;
        (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->super_Party).n_d);
  }
  return;
}

Assistant:

void Alice::LoadNextRandomPermutation()
{
    static std::ifstream pin("../randoms/alice/Permutations_PA.txt");
    static std::ifstream din("../randoms/alice/Permutations_DA.txt");
    long temp;
    Pi_P.clear();
    Pi_D.clear();
    for(int i=0; i < n_p; i++)
    {
        pin>>temp;
        Pi_P.push_back(temp);
    }
    for(int j=0; j < n_d; j++)
    {
        din>>temp;
        Pi_D.push_back(temp);
    }   
}